

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void Parser::ERROR(int line,string *type,string *sgn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string o;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  std::ostream::operator<<(local_1a8,line);
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)local_1b8,(string *)&local_278);
  std::operator+(&local_1d8,"Error at Line ",&local_278);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_248 = *plVar3;
    lStack_240 = plVar2[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *plVar3;
    local_258 = (long *)*plVar2;
  }
  local_250 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_258,(ulong)(type->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_228 = *plVar3;
    lStack_220 = plVar2[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar3;
    local_238 = (long *)*plVar2;
  }
  local_230 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_238);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_208 = *plVar3;
    lStack_200 = plVar2[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar3;
    local_218 = (long *)*plVar2;
  }
  local_210 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_218,(ulong)(sgn->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_1f8.field_2._M_allocated_capacity = *psVar4;
    local_1f8.field_2._8_8_ = plVar2[3];
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar4;
    local_1f8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_1f8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errVec_abi_cxx11_
             ,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar1) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ERROR(int line,string type,string sgn){
        stringstream ss;
        ss.str("");
        ss << line;
        string o;
        ss >> o;
        errVec.push_back("Error at Line "+o+": can't select "+type+" from "+sgn);
    }